

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O2

bool Intersect(btDbvtAabbMm *a,btDbvtAabbMm *b)

{
  if (((((a->mi).m_floats[0] <= (b->mx).m_floats[0]) && ((b->mi).m_floats[0] <= (a->mx).m_floats[0])
       ) && ((a->mi).m_floats[1] <= (b->mx).m_floats[1])) &&
     (((b->mi).m_floats[1] <= (a->mx).m_floats[1] && ((a->mi).m_floats[2] <= (b->mx).m_floats[2]))))
  {
    return (b->mi).m_floats[2] <= (a->mx).m_floats[2];
  }
  return false;
}

Assistant:

DBVT_INLINE bool		Intersect(	const btDbvtAabbMm& a,
								  const btDbvtAabbMm& b)
{
#if	DBVT_INT0_IMPL == DBVT_IMPL_SSE
	const __m128	rt(_mm_or_ps(	_mm_cmplt_ps(_mm_load_ps(b.mx),_mm_load_ps(a.mi)),
		_mm_cmplt_ps(_mm_load_ps(a.mx),_mm_load_ps(b.mi))));
#if defined (_WIN32)
	const __int32*	pu((const __int32*)&rt);
#else
    const int*	pu((const int*)&rt);
#endif
	return((pu[0]|pu[1]|pu[2])==0);
#else
	return(	(a.mi.x()<=b.mx.x())&&
		(a.mx.x()>=b.mi.x())&&
		(a.mi.y()<=b.mx.y())&&
		(a.mx.y()>=b.mi.y())&&
		(a.mi.z()<=b.mx.z())&&		
		(a.mx.z()>=b.mi.z()));
#endif
}